

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<slang::SVInt>::reallocateTo
          (SmallVectorBase<slang::SVInt> *this,size_type newCapacity)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  pointer pSVar5;
  pointer pSVar6;
  long lVar7;
  EVP_PKEY_CTX *ctx;
  
  ctx = (EVP_PKEY_CTX *)newCapacity;
  pSVar6 = (pointer)operator_new(newCapacity << 4);
  sVar4 = this->len;
  if (sVar4 != 0) {
    pSVar5 = this->data_;
    lVar7 = 0;
    do {
      uVar3 = *(uint *)((long)&(pSVar5->super_SVIntStorage).bitWidth + lVar7);
      bVar1 = (&(pSVar5->super_SVIntStorage).signFlag)[lVar7];
      bVar2 = (&(pSVar5->super_SVIntStorage).unknownFlag)[lVar7];
      *(undefined8 *)((long)&(pSVar6->super_SVIntStorage).field_0 + lVar7) = 0;
      *(uint *)((long)&(pSVar6->super_SVIntStorage).bitWidth + lVar7) = uVar3;
      (&(pSVar6->super_SVIntStorage).signFlag)[lVar7] = bVar1;
      (&(pSVar6->super_SVIntStorage).unknownFlag)[lVar7] = bVar2;
      if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
        ctx = *(EVP_PKEY_CTX **)((long)&(pSVar5->super_SVIntStorage).field_0 + lVar7);
      }
      else {
        ctx = *(EVP_PKEY_CTX **)((long)&(pSVar5->super_SVIntStorage).field_0 + lVar7);
        *(undefined8 *)((long)&(pSVar5->super_SVIntStorage).field_0 + lVar7) = 0;
      }
      *(EVP_PKEY_CTX **)((long)&(pSVar6->super_SVIntStorage).field_0 + lVar7) = ctx;
      lVar7 = lVar7 + 0x10;
    } while (sVar4 << 4 != lVar7);
  }
  cleanup(this,ctx);
  this->cap = newCapacity;
  this->data_ = pSVar6;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }